

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-monster.c
# Opt level: O1

_Bool mon_restrict(char *monster_type,wchar_t depth,wchar_t current_depth,_Bool unique_ok)

{
  wchar_t wVar1;
  _Bool _Var2;
  int iVar3;
  wchar_t wVar4;
  uint32_t uVar5;
  int iVar6;
  char *src;
  int iVar7;
  pit_profile *ppVar8;
  code *get_mon_num_hook;
  uint uVar9;
  
  base_d_char[0] = '\0';
  base_d_char[1] = '\0';
  base_d_char[2] = '\0';
  base_d_char[3] = '\0';
  base_d_char[4] = '\0';
  base_d_char[5] = '\0';
  base_d_char[6] = '\0';
  base_d_char[7] = '\0';
  base_d_char[8] = '\0';
  base_d_char[9] = '\0';
  allow_unique = unique_ok;
  select_current_level = current_depth;
  if (monster_type == (char *)0x0) {
    get_mon_num_hook = (_func__Bool_monster_race_ptr *)0x0;
  }
  else {
    iVar3 = strcmp(monster_type,"random");
    ppVar8 = pit_info;
    if (iVar3 == 0) {
      wVar4 = current_depth + L'\x03';
      if (L'\xffffffff' < current_depth) {
        wVar4 = current_depth;
      }
      uVar9 = 0;
      do {
        uVar5 = Rand_div(z_info->r_max - 1);
        iVar3 = uVar5 + 1;
        if (r_info[iVar3].rarity != L'\0') {
          _Var2 = flag_has_dbg(r_info[iVar3].flags,0xc,1,"r_info[j].flags","RF_UNIQUE");
          if (uVar9 < 200) {
            if ((!_Var2) && (wVar1 = r_info[iVar3].level, wVar1 <= depth && wVar1 != L'\0')) {
              iVar6 = wVar1 - current_depth;
              iVar7 = -iVar6;
              if (0 < iVar6) {
                iVar7 = iVar6;
              }
              if (iVar7 <= wVar4 >> 2) goto LAB_0015094a;
            }
          }
          else if ((!_Var2) && (r_info[iVar3].level != L'\0' && r_info[iVar3].level <= depth))
          goto LAB_0015094a;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != 0x9c4);
      uVar9 = 0x9c4;
LAB_0015094a:
      if (0x9c2 < uVar9) {
        return false;
      }
      src = format("%c",(ulong)(uint)(r_info[iVar3].base)->d_char);
      my_strcpy(base_d_char,src,0xf);
      get_mon_num_hook = mon_select;
    }
    else {
      for (; ppVar8 != (pit_profile *)0x0; ppVar8 = ppVar8->next) {
        if ((ppVar8->name != (char *)0x0) && (iVar3 = strcmp(monster_type,ppVar8->name), iVar3 == 0)
           ) goto LAB_00150849;
      }
      ppVar8 = (pit_profile *)0x0;
LAB_00150849:
      if (ppVar8 == (pit_profile *)0x0) {
        return ppVar8 != (pit_profile *)0x0;
      }
      dun->pit_type = ppVar8;
      get_mon_num_hook = mon_pit_hook;
    }
  }
  get_mon_num_prep(get_mon_num_hook);
  return true;
}

Assistant:

bool mon_restrict(const char *monster_type, int depth, int current_depth,
		bool unique_ok)
{
	int i, j = 0;

	/* Clear global monster restriction variables. */
	allow_unique = unique_ok;
	for (i = 0; i < 10; i++)
		base_d_char[i] = '\0';
        select_current_level = current_depth;

	/* No monster type specified, no restrictions. */
	if (monster_type == NULL) {
		get_mon_num_prep(NULL);
		return true;
	} else if (streq(monster_type, "random")) {
		/* Handle random */
		for (i = 0; i < 2500; i++) {
			/* Get a random monster. */
			j = randint1(z_info->r_max - 1);

			/* Must be a real monster */
			if (!r_info[j].rarity)
				continue;

			/* Try for close to depth, accept in-depth if necessary */
			if (i < 200) {
				if ((!rf_has(r_info[j].flags, RF_UNIQUE))
					&& (r_info[j].level != 0) && (r_info[j].level <= depth)
					&& (ABS(r_info[j].level - current_depth) <
						1 + (current_depth / 4)))
					break;
			} else {
				if ((!rf_has(r_info[j].flags, RF_UNIQUE))
					&& (r_info[j].level != 0) && (r_info[j].level <= depth))
					break;
			}
		}

		/* We've found a monster. */
		if (i < 2499) {
			/* Use that monster's base type for all monsters. */
			my_strcpy(base_d_char, format("%c", r_info[j].base->d_char),
				sizeof(base_d_char));

			/* Prepare allocation table */
			get_mon_num_prep(mon_select);
			return true;
		} else
			/* Paranoia - area stays empty if no monster is found */
			return false;
	} else {
		/* Use a pit profile */
		struct pit_profile *profile = lookup_pit_profile(monster_type);

		/* Accept the profile or leave area empty if none found */
		if (profile)
			dun->pit_type = profile;
		else
			return false;

		/* Prepare allocation table */
		get_mon_num_prep(mon_pit_hook);
		return true;
	}
}